

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall phosg::Image::save(Image *this,FILE *f,Format format)

{
  undefined1 *puVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  size_t size;
  ulong uVar5;
  long lVar6;
  runtime_error *prVar7;
  long lVar8;
  long lVar9;
  char *__format;
  ulong uVar10;
  int iVar11;
  size_t sVar12;
  long lVar13;
  unique_ptr<void,_void_(*)(void_*)> row_data_unique;
  uint8_t row_padding_data [4];
  uLongf idat_size;
  be_uint32_t gAMA;
  uint8_t SIG [8];
  anon_struct_13_7_88857fac IHDR;
  char header [256];
  code *local_1a8;
  void *local_1a0;
  undefined4 local_198;
  undefined4 uStack_194;
  void *local_190;
  anon_class_8_1_54a39806 local_188;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  size_t local_170;
  size_t local_168;
  ulong local_160;
  undefined4 local_154;
  undefined8 local_150;
  uint local_148;
  uint local_144;
  undefined1 local_140;
  byte local_13f;
  undefined2 local_13e;
  undefined1 local_13c;
  undefined1 local_138 [34];
  int local_116;
  undefined8 local_112;
  undefined8 uStack_10a;
  undefined8 local_102;
  undefined8 uStack_fa;
  undefined4 local_f2;
  undefined4 local_be;
  
  local_188.f = f;
  switch(format) {
  case GRAYSCALE_PPM:
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar7,"can\'t save grayscale ppm files");
    break;
  case COLOR_PPM:
    __format = "P6 %zu %zu %lu\n";
    if (this->has_alpha != false) {
      __format = "P7\nWIDTH %zu\nHEIGHT %zu\nDEPTH 4\nMAXVAL %lu\nTUPLTYPE RGB_ALPHA\nENDHDR\n";
    }
    snprintf(local_138,0x100,__format,this->width,this->height,this->max_value);
    size = strlen(local_138);
    fwritex(f,local_138,size);
    fwritex(f,(this->data).raw,
            (ulong)(this->channel_width >> 3) * ((ulong)this->has_alpha + 3) *
            this->height * this->width);
    return;
  case WINDOWS_BITMAP:
    if (this->channel_width == '\b') {
      bVar3 = this->has_alpha;
      local_160 = (ulong)bVar3;
      local_17c = bVar3 + 3;
      local_174 = (int)this->width;
      uVar4 = -(local_174 * local_17c) & 3;
      local_198 = 0;
      local_180 = (int)this->height;
      iVar11 = local_180 * local_174;
      lVar13 = 0x28;
      if (bVar3 != false) {
        lVar13 = 0x7c;
      }
      local_178 = iVar11 * 4;
      if (bVar3 == false) {
        local_178 = 0;
      }
      local_168 = lVar13 + 0xe;
      memset(local_138,0,0x8a);
      local_138._0_2_ = 0x4d42;
      local_138._10_4_ = (undefined4)local_168;
      local_138._2_4_ = iVar11 * local_17c + local_138._10_4_ + local_180 * uVar4;
      local_138._6_4_ = 0;
      local_138._14_4_ = (undefined4)lVar13;
      local_138._18_4_ = local_174;
      local_138._22_4_ = local_180;
      local_138._26_2_ = 1;
      local_138._28_2_ = (short)local_160 * 8 + 0x18;
      local_138._30_4_ = (int)local_160 * 3;
      local_116 = local_178;
      local_112 = 0xb1200000b12;
      uStack_10a = 0;
      if ((int)local_160 == 1) {
        local_102 = 0xff00000000ff;
        uStack_fa = 0xff00000000ff0000;
        local_f2 = 0x73524742;
        local_be = 8;
      }
      fwritex(f,local_138,local_168);
      if (this->has_alpha == true) {
        lVar13 = this->height;
        if (lVar13 < 1) {
          return;
        }
        lVar8 = lVar13 * 4;
        lVar13 = lVar13 + 1;
        do {
          lVar8 = lVar8 + -4;
          fwritex(f,(void *)(lVar8 * this->width + (long)(this->data).raw),this->width << 2);
          lVar13 = lVar13 + -1;
        } while (1 < lVar13);
        return;
      }
      malloc_unique((phosg *)&local_1a8,this->width * 3);
      pvVar2 = local_1a0;
      lVar13 = this->height;
      if (0 < lVar13) {
        lVar8 = lVar13 * 3;
        do {
          lVar8 = lVar8 + -3;
          lVar9 = this->width;
          if (lVar9 < 1) {
            sVar12 = lVar9 * 3;
          }
          else {
            lVar6 = 0;
            do {
              *(undefined1 *)((long)pvVar2 + lVar6) =
                   *(undefined1 *)((long)(this->data).raw + lVar6 + 2 + lVar9 * lVar8);
              *(undefined1 *)((long)pvVar2 + lVar6 + 1) =
                   *(undefined1 *)((long)(this->data).raw + lVar6 + 1 + this->width * lVar8);
              *(undefined1 *)((long)pvVar2 + lVar6 + 2) =
                   *(undefined1 *)((long)(this->data).raw + lVar6 + this->width * lVar8);
              lVar6 = lVar6 + 3;
              lVar9 = this->width;
              sVar12 = lVar9 * 3;
            } while (SBORROW8(lVar6,sVar12) != lVar6 + lVar9 * -3 < 0);
          }
          fwritex(f,pvVar2,sVar12);
          if ((ulong)uVar4 != 0) {
            fwritex(f,&local_198,(ulong)uVar4);
          }
          bVar3 = 1 < lVar13;
          lVar13 = lVar13 + -1;
        } while (bVar3);
      }
      if (local_1a0 == (void *)0x0) {
        return;
      }
      (*local_1a8)();
      return;
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar7,"can\'t save bmp with more than 8-bit channels");
    break;
  case PNG:
    if (this->channel_width == '\b') {
      local_150 = 0xa1a0a0d474e5089;
      fwritex(f,&local_150,8);
      uVar4 = (uint)this->width;
      local_148 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      uVar4 = (uint)this->height;
      local_144 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      local_140 = 8;
      local_13f = this->has_alpha << 2 | 2;
      local_13e = 0;
      local_13c = 0;
      write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
                ((char (*) [5])"IHDR",&local_148,(be_uint32_t)0xd000000,&local_188);
      local_154 = 0x8fb10000;
      write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
                ((char (*) [5])"gAMA",&local_154,(be_uint32_t)0x4000000,&local_188);
      lVar13 = (ulong)this->has_alpha + 3;
      sVar12 = (this->width * lVar13 + 1) * this->height;
      malloc_unique((phosg *)&local_1a8,sVar12);
      if (this->height != 0) {
        uVar5 = 0;
        uVar10 = 1;
        do {
          lVar8 = this->width * lVar13;
          pvVar2 = (this->data).raw;
          puVar1 = (undefined1 *)((long)local_1a0 + (lVar8 + 1) * uVar5);
          *puVar1 = 0;
          memcpy(puVar1 + 1,(void *)(lVar8 * uVar5 + (long)pvVar2),this->width * lVar13);
          bVar3 = uVar10 < (ulong)this->height;
          uVar5 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar3);
      }
      local_170 = compressBound(sVar12);
      malloc_unique((phosg *)&local_198,local_170);
      uVar4 = compress2(local_190,&local_170,local_1a0,sVar12,9);
      if (uVar4 == 0) {
        write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
                  ((char (*) [5])"IDAT",local_190,
                   (be_uint32_t)
                   ((uint)local_170 >> 0x18 | ((uint)local_170 & 0xff0000) >> 8 |
                    ((uint)local_170 & 0xff00) << 8 | (uint)local_170 << 0x18),&local_188);
        write_png_chunk<phosg::Image::save(_IO_FILE*,phosg::Image::Format)const::__0&>
                  ((char (*) [5])"IEND",(void *)0x0,(be_uint32_t)0x0,&local_188);
        if (local_190 != (void *)0x0) {
          (*(code *)CONCAT44(uStack_194,local_198))();
        }
        if (local_1a0 == (void *)0x0) {
          return;
        }
        (*local_1a8)();
        return;
      }
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      string_printf_abi_cxx11_
                ((string *)local_138,"zlib error compressing png data: %d",(ulong)uVar4);
      ::std::runtime_error::runtime_error(prVar7,(string *)local_138);
      __cxa_throw(prVar7,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar7,"can\'t save png with more than 8-bit channels");
    break;
  default:
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar7,"unknown file format in Image::save()");
  }
  __cxa_throw(prVar7,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Image::save(FILE* f, Format format) const {
  this->save_helper(format, [f](const void* data, size_t size) {
    fwritex(f, data, size);
  });
}